

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

_Bool store_is_staple(store *s,object_kind *k)

{
  object_kind *l;
  size_t i;
  object_kind *k_local;
  store *s_local;
  
  if (s == (store *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                  ,0x211,"_Bool store_is_staple(struct store *, struct object_kind *)");
  }
  if (k != (object_kind *)0x0) {
    l = (object_kind *)0x0;
    while( true ) {
      if ((object_kind *)s->always_num <= l) {
        return false;
      }
      if (k == s->always_table[(long)l]) break;
      l = (object_kind *)((long)&l->name + 1);
    }
    return true;
  }
  __assert_fail("k",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                ,0x212,"_Bool store_is_staple(struct store *, struct object_kind *)");
}

Assistant:

static bool store_is_staple(struct store *s, struct object_kind *k) {
	size_t i;

	assert(s);
	assert(k);

	for (i = 0; i < s->always_num; i++) {
		struct object_kind *l = s->always_table[i];
		if (k == l)
			return true;
	}

	return false;
}